

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprCachePop(Parse *pParse)

{
  int local_14;
  int i;
  Parse *pParse_local;
  
  local_14 = 0;
  pParse->iCacheLevel = pParse->iCacheLevel + -1;
  while (local_14 < (int)(uint)pParse->nColCache) {
    if (pParse->iCacheLevel < pParse->aColCache[local_14].iLevel) {
      cacheEntryClear(pParse,local_14);
    }
    else {
      local_14 = local_14 + 1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCachePop(Parse *pParse){
  int i = 0;
  assert( pParse->iCacheLevel>=1 );
  pParse->iCacheLevel--;
#ifdef SQLITE_DEBUG
  if( pParse->db->flags & SQLITE_VdbeAddopTrace ){
    printf("POP  to %d\n", pParse->iCacheLevel);
  }
#endif
  while( i<pParse->nColCache ){
    if( pParse->aColCache[i].iLevel>pParse->iCacheLevel ){
      cacheEntryClear(pParse, i);
    }else{
      i++;
    }
  }
}